

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error handleUnknownEncoding(XML_Parser parser,XML_Char *encodingName)

{
  XML_UnknownEncodingHandler p_Var1;
  _func_void_ptr_size_t *p_Var2;
  bool bVar3;
  int iVar4;
  void *mem;
  ENCODING *pEVar5;
  XML_Error XVar6;
  XML_Encoding local_440;
  
  p_Var1 = parser->m_unknownEncodingHandler;
  if (p_Var1 == (XML_UnknownEncodingHandler)0x0) {
    return XML_ERROR_UNKNOWN_ENCODING;
  }
  memset(&local_440,0xff,0x400);
  local_440.data = (void *)0x0;
  local_440.convert = (CONVERTER)0x0;
  local_440.release = (_func_void_void_ptr *)0x0;
  iVar4 = (*p_Var1)(parser->m_unknownEncodingHandlerData,encodingName,&local_440);
  if (iVar4 != 0) {
    p_Var2 = (parser->m_mem).malloc_fcn;
    iVar4 = XmlSizeOfUnknownEncoding();
    mem = (*p_Var2)((long)iVar4);
    parser->m_unknownEncodingMem = mem;
    if (mem == (void *)0x0) {
      parser = (XML_Parser)0x1;
      if (local_440.release != (_func_void_void_ptr *)0x0) {
        (*local_440.release)(local_440.data);
      }
LAB_0045a6e8:
      bVar3 = false;
    }
    else {
      pEVar5 = XmlInitUnknownEncoding(mem,local_440.map,local_440.convert,local_440.data);
      if (pEVar5 != (ENCODING *)0x0) {
        parser->m_unknownEncodingData = local_440.data;
        parser->m_unknownEncodingRelease = local_440.release;
        parser->m_encoding = pEVar5;
        parser = (XML_Parser)0x0;
        goto LAB_0045a6e8;
      }
      bVar3 = true;
    }
    XVar6 = (XML_Error)parser;
    if (!bVar3) {
      bVar3 = false;
      goto LAB_0045a710;
    }
  }
  XVar6 = (XML_Error)parser;
  bVar3 = true;
  if (local_440.release != (_func_void_void_ptr *)0x0) {
    (*local_440.release)(local_440.data);
  }
LAB_0045a710:
  if (bVar3) {
    return XML_ERROR_UNKNOWN_ENCODING;
  }
  return XVar6;
}

Assistant:

static enum XML_Error
handleUnknownEncoding(XML_Parser parser, const XML_Char *encodingName)
{
  if (parser->m_unknownEncodingHandler) {
    XML_Encoding info;
    int i;
    for (i = 0; i < 256; i++)
      info.map[i] = -1;
    info.convert = NULL;
    info.data = NULL;
    info.release = NULL;
    if (parser->m_unknownEncodingHandler(parser->m_unknownEncodingHandlerData, encodingName,
                               &info)) {
      ENCODING *enc;
      parser->m_unknownEncodingMem = MALLOC(parser, XmlSizeOfUnknownEncoding());
      if (!parser->m_unknownEncodingMem) {
        if (info.release)
          info.release(info.data);
        return XML_ERROR_NO_MEMORY;
      }
      enc = (parser->m_ns
             ? XmlInitUnknownEncodingNS
             : XmlInitUnknownEncoding)(parser->m_unknownEncodingMem,
                                       info.map,
                                       info.convert,
                                       info.data);
      if (enc) {
        parser->m_unknownEncodingData = info.data;
        parser->m_unknownEncodingRelease = info.release;
        parser->m_encoding = enc;
        return XML_ERROR_NONE;
      }
    }
    if (info.release != NULL)
      info.release(info.data);
  }
  return XML_ERROR_UNKNOWN_ENCODING;
}